

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O1

IHEVCD_ERROR_T ihevcd_parse_pps(codec_t *ps_codec)

{
  bitstrm_t *ps_bitstrm;
  pps_t *ppVar1;
  sps_t *psVar2;
  tile_t *ptVar3;
  WORD16 WVar4;
  byte bVar5;
  byte bVar6;
  UWORD32 UVar7;
  WORD32 WVar8;
  IHEVCD_ERROR_T IVar9;
  uint uVar10;
  long lVar11;
  char cVar12;
  int iVar13;
  byte bVar14;
  UWORD8 *pUVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  
  if (ps_codec->i4_sps_done == 0) {
    return IHEVCD_INVALID_HEADER;
  }
  ps_bitstrm = &(ps_codec->s_parse).s_bitstrm;
  UVar7 = ihevcd_uev(ps_bitstrm);
  if (0x40 < UVar7) {
    if (ps_codec->i4_pps_done != 0) {
      return IHEVCD_UNSUPPORTED_PPS_ID;
    }
    UVar7 = 0;
  }
  ppVar1 = (ps_codec->s_parse).ps_pps_base;
  ppVar1[0x40].i1_pps_id = (WORD8)UVar7;
  UVar7 = ihevcd_uev(ps_bitstrm);
  bVar5 = (byte)UVar7;
  bVar14 = 0;
  if (-1 < (char)bVar5) {
    bVar14 = bVar5;
  }
  bVar6 = 0xf;
  if ((char)bVar5 < '\x10') {
    bVar6 = bVar14;
  }
  ppVar1[0x40].i1_sps_id = bVar6;
  psVar2 = (ps_codec->s_parse).ps_sps_base;
  if (psVar2[bVar6].i1_sps_valid == '\0') {
LAB_00111896:
    IVar9 = IHEVCD_INVALID_HEADER;
  }
  else {
    UVar7 = ihevcd_bits_get(ps_bitstrm,1);
    ppVar1[0x40].i1_dependent_slice_enabled_flag = (WORD8)UVar7;
    UVar7 = ihevcd_bits_get(ps_bitstrm,1);
    ppVar1[0x40].i1_output_flag_present_flag = (WORD8)UVar7;
    UVar7 = ihevcd_bits_get(ps_bitstrm,3);
    ppVar1[0x40].i1_num_extra_slice_header_bits = (WORD8)UVar7;
    UVar7 = ihevcd_bits_get(ps_bitstrm,1);
    ppVar1[0x40].i1_sign_data_hiding_flag = (WORD8)UVar7;
    UVar7 = ihevcd_bits_get(ps_bitstrm,1);
    ppVar1[0x40].i1_cabac_init_present_flag = (WORD8)UVar7;
    UVar7 = ihevcd_uev(ps_bitstrm);
    ppVar1[0x40].i1_num_ref_idx_l0_default_active = (char)UVar7 + '\x01';
    UVar7 = ihevcd_uev(ps_bitstrm);
    ppVar1[0x40].i1_num_ref_idx_l1_default_active = (char)UVar7 + '\x01';
    WVar8 = ihevcd_sev(ps_bitstrm);
    ppVar1[0x40].i1_pic_init_qp = (char)WVar8 + '\x1a';
    UVar7 = ihevcd_bits_get(ps_bitstrm,1);
    ppVar1[0x40].i1_constrained_intra_pred_flag = (WORD8)UVar7;
    UVar7 = ihevcd_bits_get(ps_bitstrm,1);
    ppVar1[0x40].i1_transform_skip_enabled_flag = (WORD8)UVar7;
    UVar7 = ihevcd_bits_get(ps_bitstrm,1);
    ppVar1[0x40].i1_cu_qp_delta_enabled_flag = (char)UVar7;
    if ((char)UVar7 == '\0') {
      cVar12 = '\0';
    }
    else {
      UVar7 = ihevcd_uev(ps_bitstrm);
      cVar12 = (char)UVar7;
    }
    ppVar1[0x40].i1_diff_cu_qp_delta_depth = cVar12;
    ppVar1[0x40].i1_log2_min_cu_qp_delta_size = psVar2[bVar6].i1_log2_ctb_size - cVar12;
    WVar8 = ihevcd_sev(ps_bitstrm);
    ppVar1[0x40].i1_pic_cb_qp_offset = (WORD8)WVar8;
    WVar8 = ihevcd_sev(ps_bitstrm);
    ppVar1[0x40].i1_pic_cr_qp_offset = (WORD8)WVar8;
    UVar7 = ihevcd_bits_get(ps_bitstrm,1);
    ppVar1[0x40].i1_pic_slice_level_chroma_qp_offsets_present_flag = (WORD8)UVar7;
    UVar7 = ihevcd_bits_get(ps_bitstrm,1);
    ppVar1[0x40].i1_weighted_pred_flag = (WORD8)UVar7;
    UVar7 = ihevcd_bits_get(ps_bitstrm,1);
    ppVar1[0x40].i1_weighted_bipred_flag = (WORD8)UVar7;
    UVar7 = ihevcd_bits_get(ps_bitstrm,1);
    ppVar1[0x40].i1_transquant_bypass_enable_flag = (WORD8)UVar7;
    UVar7 = ihevcd_bits_get(ps_bitstrm,1);
    ppVar1[0x40].i1_tiles_enabled_flag = (WORD8)UVar7;
    UVar7 = ihevcd_bits_get(ps_bitstrm,1);
    ppVar1[0x40].i1_entropy_coding_sync_enabled_flag = (WORD8)UVar7;
    ppVar1[0x40].i1_loop_filter_across_tiles_enabled_flag = '\0';
    if (ppVar1[0x40].i1_tiles_enabled_flag == '\0') {
      ppVar1[0x40].i1_num_tile_columns = '\x01';
      ppVar1[0x40].i1_num_tile_rows = '\x01';
      ppVar1[0x40].i1_uniform_spacing_flag = '\x01';
      ptVar3 = ppVar1[0x40].ps_tile;
      ptVar3->u1_pos_x = '\0';
      ptVar3->u1_pos_y = '\0';
      WVar4 = psVar2[bVar6].i2_pic_ht_in_ctb;
      ptVar3->u2_wd = psVar2[bVar6].i2_pic_wd_in_ctb;
      ptVar3->u2_ht = WVar4;
    }
    else {
      UVar7 = ihevcd_uev(ps_bitstrm);
      ppVar1[0x40].i1_num_tile_columns = (char)UVar7 + '\x01';
      UVar7 = ihevcd_uev(ps_bitstrm);
      cVar12 = (byte)UVar7 + 1;
      ppVar1[0x40].i1_num_tile_rows = cVar12;
      if (((ppVar1[0x40].i1_num_tile_columns < '\x01') ||
          (0x7e < (byte)UVar7 ||
           psVar2[bVar6].i2_pic_wd_in_ctb < (short)ppVar1[0x40].i1_num_tile_columns)) ||
         (psVar2[bVar6].i2_pic_ht_in_ctb < (short)cVar12)) goto LAB_00111896;
      UVar7 = ihevcd_bits_get(ps_bitstrm,1);
      ppVar1[0x40].i1_uniform_spacing_flag = (WORD8)UVar7;
      uVar18 = (ulong)(uint)(int)ppVar1[0x40].i1_num_tile_columns;
      if (0 < ppVar1[0x40].i1_num_tile_columns) {
        lVar20 = 0;
        lVar17 = 2;
        iVar16 = 0;
        do {
          iVar13 = (int)uVar18;
          if (ppVar1[0x40].i1_uniform_spacing_flag == '\0') {
            if (lVar20 < iVar13 + -1) {
              UVar7 = ihevcd_uev(ps_bitstrm);
              iVar13 = UVar7 + 1;
            }
            else {
              iVar13 = psVar2[bVar6].i2_pic_wd_in_ctb - iVar16;
            }
          }
          else {
            iVar13 = (((int)lVar20 + 1) * (int)psVar2[bVar6].i2_pic_wd_in_ctb) / iVar13 -
                     ((int)psVar2[bVar6].i2_pic_wd_in_ctb * (int)lVar20) / iVar13;
          }
          lVar11 = (long)ppVar1[0x40].i1_num_tile_rows;
          if (0 < lVar11) {
            cVar12 = ppVar1[0x40].i1_num_tile_columns;
            pUVar15 = &(ppVar1[0x40].ps_tile)->u1_pos_x + lVar17;
            do {
              pUVar15[-2] = (char)iVar16;
              *(short *)pUVar15 = (short)iVar13;
              pUVar15 = pUVar15 + (long)cVar12 * 6;
              lVar11 = lVar11 + -1;
            } while (lVar11 != 0);
          }
          if ((iVar13 < 1) || (iVar16 = iVar16 + iVar13, psVar2[bVar6].i2_pic_wd_in_ctb < iVar16))
          goto LAB_00111896;
          lVar20 = lVar20 + 1;
          uVar18 = (ulong)ppVar1[0x40].i1_num_tile_columns;
          lVar17 = lVar17 + 6;
        } while (lVar20 < (long)uVar18);
      }
      iVar16 = (int)ppVar1[0x40].i1_num_tile_rows;
      if ('\0' < ppVar1[0x40].i1_num_tile_rows) {
        iVar13 = 0;
        iVar19 = 0;
        do {
          if (ppVar1[0x40].i1_uniform_spacing_flag == '\0') {
            if (iVar19 < iVar16 + -1) {
              UVar7 = ihevcd_uev(ps_bitstrm);
              iVar16 = UVar7 + 1;
            }
            else {
              iVar16 = psVar2[bVar6].i2_pic_ht_in_ctb - iVar13;
            }
          }
          else {
            iVar16 = ((iVar19 + 1) * (int)psVar2[bVar6].i2_pic_ht_in_ctb) / iVar16 -
                     (psVar2[bVar6].i2_pic_ht_in_ctb * iVar19) / iVar16;
          }
          cVar12 = ppVar1[0x40].i1_num_tile_columns;
          if ('\0' < cVar12) {
            ptVar3 = ppVar1[0x40].ps_tile;
            uVar10 = cVar12 * iVar19;
            lVar17 = 0;
            do {
              (&ptVar3[uVar10].u1_pos_y)[lVar17] = (UWORD8)iVar13;
              *(short *)((long)&ptVar3[uVar10].u2_ht + lVar17) = (short)iVar16;
              lVar17 = lVar17 + 6;
            } while ((long)(int)cVar12 * 6 != lVar17);
          }
          if ((iVar16 < 1) || (iVar13 = iVar13 + iVar16, psVar2[bVar6].i2_pic_ht_in_ctb < iVar13))
          goto LAB_00111896;
          iVar19 = iVar19 + 1;
          iVar16 = (int)ppVar1[0x40].i1_num_tile_rows;
        } while (iVar19 < iVar16);
      }
      UVar7 = ihevcd_bits_get(ps_bitstrm,1);
      ppVar1[0x40].i1_loop_filter_across_tiles_enabled_flag = (WORD8)UVar7;
    }
    UVar7 = ihevcd_bits_get(ps_bitstrm,1);
    ppVar1[0x40].i1_loop_filter_across_slices_enabled_flag = (WORD8)UVar7;
    UVar7 = ihevcd_bits_get(ps_bitstrm,1);
    ppVar1[0x40].i1_deblocking_filter_control_present_flag = (char)UVar7;
    ppVar1[0x40].i1_deblocking_filter_override_enabled_flag = '\0';
    ppVar1[0x40].i1_pic_disable_deblocking_filter_flag = '\0';
    ppVar1[0x40].i1_beta_offset_div2 = '\0';
    ppVar1[0x40].i1_tc_offset_div2 = '\0';
    if ((char)UVar7 != '\0') {
      UVar7 = ihevcd_bits_get(ps_bitstrm,1);
      ppVar1[0x40].i1_deblocking_filter_override_enabled_flag = (WORD8)UVar7;
      UVar7 = ihevcd_bits_get(ps_bitstrm,1);
      ppVar1[0x40].i1_pic_disable_deblocking_filter_flag = (char)UVar7;
      if ((char)UVar7 == '\0') {
        WVar8 = ihevcd_sev(ps_bitstrm);
        ppVar1[0x40].i1_beta_offset_div2 = (WORD8)WVar8;
        WVar8 = ihevcd_sev(ps_bitstrm);
        ppVar1[0x40].i1_tc_offset_div2 = (WORD8)WVar8;
      }
    }
    UVar7 = ihevcd_bits_get(ps_bitstrm,1);
    ppVar1[0x40].i1_pps_scaling_list_data_present_flag = (char)UVar7;
    if ((char)UVar7 != '\0') {
      memcpy(ppVar1[0x40].pi2_scaling_mat,gi2_flat_scale_mat_32x32,0xc0);
      memcpy(ppVar1[0x40].pi2_scaling_mat + 0x60,gi2_intra_default_scale_mat_8x8,0x80);
      memcpy(ppVar1[0x40].pi2_scaling_mat + 0xa0,gi2_intra_default_scale_mat_8x8,0x80);
      memcpy(ppVar1[0x40].pi2_scaling_mat + 0xe0,gi2_intra_default_scale_mat_8x8,0x80);
      memcpy(ppVar1[0x40].pi2_scaling_mat + 0x120,gi2_inter_default_scale_mat_8x8,0x80);
      memcpy(ppVar1[0x40].pi2_scaling_mat + 0x160,gi2_inter_default_scale_mat_8x8,0x80);
      memcpy(ppVar1[0x40].pi2_scaling_mat + 0x1a0,gi2_inter_default_scale_mat_8x8,0x80);
      memcpy(ppVar1[0x40].pi2_scaling_mat + 0x1e0,gi2_intra_default_scale_mat_16x16,0x200);
      memcpy(ppVar1[0x40].pi2_scaling_mat + 0x2e0,gi2_intra_default_scale_mat_16x16,0x200);
      memcpy(ppVar1[0x40].pi2_scaling_mat + 0x3e0,gi2_intra_default_scale_mat_16x16,0x200);
      memcpy(ppVar1[0x40].pi2_scaling_mat + 0x4e0,gi2_inter_default_scale_mat_16x16,0x200);
      memcpy(ppVar1[0x40].pi2_scaling_mat + 0x5e0,gi2_inter_default_scale_mat_16x16,0x200);
      memcpy(ppVar1[0x40].pi2_scaling_mat + 0x6e0,gi2_inter_default_scale_mat_16x16,0x200);
      memcpy(ppVar1[0x40].pi2_scaling_mat + 0x7e0,gi2_intra_default_scale_mat_32x32,0x800);
      memcpy(ppVar1[0x40].pi2_scaling_mat + 0xbe0,gi2_inter_default_scale_mat_32x32,0x800);
      ihevcd_scaling_list_data(ps_codec,ppVar1[0x40].pi2_scaling_mat);
    }
    UVar7 = ihevcd_bits_get(ps_bitstrm,1);
    ppVar1[0x40].i1_lists_modification_present_flag = (WORD8)UVar7;
    UVar7 = ihevcd_uev(ps_bitstrm);
    ppVar1[0x40].i1_log2_parallel_merge_level = (char)UVar7 + '\x02';
    UVar7 = ihevcd_bits_get(ps_bitstrm,1);
    ppVar1[0x40].i1_slice_header_extension_present_flag = (WORD8)UVar7;
    ihevcd_bits_get(ps_bitstrm,1);
    ps_codec->i4_pps_done = 1;
    IVar9 = 0;
  }
  return IVar9;
}

Assistant:

IHEVCD_ERROR_T ihevcd_parse_pps(codec_t *ps_codec)
{
    IHEVCD_ERROR_T ret = (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
    WORD32 value;
    WORD32 pps_id;

    pps_t *ps_pps;
    sps_t *ps_sps;
    bitstrm_t *ps_bitstrm = &ps_codec->s_parse.s_bitstrm;


    if(0 == ps_codec->i4_sps_done)
        return IHEVCD_INVALID_HEADER;

    UEV_PARSE("pic_parameter_set_id", value, ps_bitstrm);

    pps_id = value;
    if((pps_id >= MAX_PPS_CNT) || (pps_id < 0))
    {
        if(ps_codec->i4_pps_done)
            return IHEVCD_UNSUPPORTED_PPS_ID;
        else
            pps_id = 0;
    }


    ps_pps = (ps_codec->s_parse.ps_pps_base + MAX_PPS_CNT - 1);

    ps_pps->i1_pps_id = pps_id;

    UEV_PARSE("seq_parameter_set_id", value, ps_bitstrm);
    ps_pps->i1_sps_id = value;
    ps_pps->i1_sps_id = CLIP3(ps_pps->i1_sps_id, 0, MAX_SPS_CNT - 2);

    ps_sps = (ps_codec->s_parse.ps_sps_base + ps_pps->i1_sps_id);

    /* If the SPS that is being referred to has not been parsed,
     * copy an existing SPS to the current location */
    if(0 == ps_sps->i1_sps_valid)
    {
        return IHEVCD_INVALID_HEADER;

/*
        sps_t *ps_sps_ref = ps_codec->ps_sps_base;
        while(0 == ps_sps_ref->i1_sps_valid)
            ps_sps_ref++;
        ihevcd_copy_sps(ps_codec, ps_pps->i1_sps_id, ps_sps_ref->i1_sps_id);
*/
    }

    BITS_PARSE("dependent_slices_enabled_flag", value, ps_bitstrm, 1);
    ps_pps->i1_dependent_slice_enabled_flag = value;

    BITS_PARSE("output_flag_present_flag", value, ps_bitstrm, 1);
    ps_pps->i1_output_flag_present_flag = value;

    BITS_PARSE("num_extra_slice_header_bits", value, ps_bitstrm, 3);
    ps_pps->i1_num_extra_slice_header_bits = value;


    BITS_PARSE("sign_data_hiding_flag", value, ps_bitstrm, 1);
    ps_pps->i1_sign_data_hiding_flag = value;

    BITS_PARSE("cabac_init_present_flag", value, ps_bitstrm, 1);
    ps_pps->i1_cabac_init_present_flag = value;

    UEV_PARSE("num_ref_idx_l0_default_active_minus1", value, ps_bitstrm);
    ps_pps->i1_num_ref_idx_l0_default_active = value + 1;

    UEV_PARSE("num_ref_idx_l1_default_active_minus1", value, ps_bitstrm);
    ps_pps->i1_num_ref_idx_l1_default_active = value + 1;

    SEV_PARSE("pic_init_qp_minus26", value, ps_bitstrm);
    ps_pps->i1_pic_init_qp = value + 26;

    BITS_PARSE("constrained_intra_pred_flag", value, ps_bitstrm, 1);
    ps_pps->i1_constrained_intra_pred_flag = value;

    BITS_PARSE("transform_skip_enabled_flag", value, ps_bitstrm, 1);
    ps_pps->i1_transform_skip_enabled_flag = value;

    BITS_PARSE("cu_qp_delta_enabled_flag", value, ps_bitstrm, 1);
    ps_pps->i1_cu_qp_delta_enabled_flag = value;

    if(ps_pps->i1_cu_qp_delta_enabled_flag)
    {
        UEV_PARSE("diff_cu_qp_delta_depth", value, ps_bitstrm);
        ps_pps->i1_diff_cu_qp_delta_depth = value;
    }
    else
    {
        ps_pps->i1_diff_cu_qp_delta_depth = 0;
    }
    ps_pps->i1_log2_min_cu_qp_delta_size = ps_sps->i1_log2_ctb_size - ps_pps->i1_diff_cu_qp_delta_depth;
    /* Print different */
    SEV_PARSE("cb_qp_offset", value, ps_bitstrm);
    ps_pps->i1_pic_cb_qp_offset = value;

    /* Print different */
    SEV_PARSE("cr_qp_offset", value, ps_bitstrm);
    ps_pps->i1_pic_cr_qp_offset = value;

    /* Print different */
    BITS_PARSE("slicelevel_chroma_qp_flag", value, ps_bitstrm, 1);
    ps_pps->i1_pic_slice_level_chroma_qp_offsets_present_flag = value;

    BITS_PARSE("weighted_pred_flag", value, ps_bitstrm, 1);
    ps_pps->i1_weighted_pred_flag = value;

    BITS_PARSE("weighted_bipred_flag", value, ps_bitstrm, 1);
    ps_pps->i1_weighted_bipred_flag = value;

    BITS_PARSE("transquant_bypass_enable_flag", value, ps_bitstrm, 1);
    ps_pps->i1_transquant_bypass_enable_flag = value;

    BITS_PARSE("tiles_enabled_flag", value, ps_bitstrm, 1);
    ps_pps->i1_tiles_enabled_flag = value;

    BITS_PARSE("entropy_coding_sync_enabled_flag", value, ps_bitstrm, 1);
    ps_pps->i1_entropy_coding_sync_enabled_flag = value;

    ps_pps->i1_loop_filter_across_tiles_enabled_flag = 0;
    if(ps_pps->i1_tiles_enabled_flag)
    {
        UEV_PARSE("num_tile_columns_minus1", value, ps_bitstrm);
        ps_pps->i1_num_tile_columns = value + 1;

        UEV_PARSE("num_tile_rows_minus1", value, ps_bitstrm);
        ps_pps->i1_num_tile_rows = value + 1;

        if((ps_pps->i1_num_tile_columns < 1) ||
                        (ps_pps->i1_num_tile_columns > ps_sps->i2_pic_wd_in_ctb) ||
                        (ps_pps->i1_num_tile_rows < 1) ||
                        (ps_pps->i1_num_tile_rows > ps_sps->i2_pic_ht_in_ctb))
            return IHEVCD_INVALID_HEADER;

        BITS_PARSE("uniform_spacing_flag", value, ps_bitstrm, 1);
        ps_pps->i1_uniform_spacing_flag = value;


        {

            WORD32 start;
            WORD32 i, j;


            start = 0;
            for(i = 0; i < ps_pps->i1_num_tile_columns; i++)
            {
                tile_t *ps_tile;
                if(!ps_pps->i1_uniform_spacing_flag)
                {
                    if(i < (ps_pps->i1_num_tile_columns - 1))
                    {
                        UEV_PARSE("column_width_minus1[ i ]", value, ps_bitstrm);
                        value += 1;
                    }
                    else
                    {
                        value = ps_sps->i2_pic_wd_in_ctb - start;
                    }
                }
                else
                {
                    value = ((i + 1) * ps_sps->i2_pic_wd_in_ctb) / ps_pps->i1_num_tile_columns -
                                    (i * ps_sps->i2_pic_wd_in_ctb) / ps_pps->i1_num_tile_columns;
                }

                for(j = 0; j < ps_pps->i1_num_tile_rows; j++)
                {
                    ps_tile = ps_pps->ps_tile + j * ps_pps->i1_num_tile_columns + i;
                    ps_tile->u1_pos_x = start;
                    ps_tile->u2_wd = value;
                }
                start += value;

                if((start > ps_sps->i2_pic_wd_in_ctb) ||
                                (value <= 0))
                    return IHEVCD_INVALID_HEADER;
            }

            start = 0;
            for(i = 0; i < (ps_pps->i1_num_tile_rows); i++)
            {
                tile_t *ps_tile;
                if(!ps_pps->i1_uniform_spacing_flag)
                {
                    if(i < (ps_pps->i1_num_tile_rows - 1))
                    {

                        UEV_PARSE("row_height_minus1[ i ]", value, ps_bitstrm);
                        value += 1;
                    }
                    else
                    {
                        value = ps_sps->i2_pic_ht_in_ctb - start;
                    }
                }
                else
                {
                    value = ((i + 1) * ps_sps->i2_pic_ht_in_ctb) / ps_pps->i1_num_tile_rows -
                                    (i * ps_sps->i2_pic_ht_in_ctb) / ps_pps->i1_num_tile_rows;
                }

                for(j = 0; j < ps_pps->i1_num_tile_columns; j++)
                {
                    ps_tile = ps_pps->ps_tile + i * ps_pps->i1_num_tile_columns + j;
                    ps_tile->u1_pos_y = start;
                    ps_tile->u2_ht = value;
                }
                start += value;

                if((start > ps_sps->i2_pic_ht_in_ctb) ||
                                (value <= 0))
                    return IHEVCD_INVALID_HEADER;
            }
        }


        BITS_PARSE("loop_filter_across_tiles_enabled_flag", value, ps_bitstrm, 1);
        ps_pps->i1_loop_filter_across_tiles_enabled_flag = value;

    }
    else
    {
        /* If tiles are not present, set first tile in each PPS to have tile
        width and height equal to picture width and height */
        ps_pps->i1_num_tile_columns = 1;
        ps_pps->i1_num_tile_rows = 1;
        ps_pps->i1_uniform_spacing_flag = 1;

        ps_pps->ps_tile->u1_pos_x = 0;
        ps_pps->ps_tile->u1_pos_y = 0;
        ps_pps->ps_tile->u2_wd = ps_sps->i2_pic_wd_in_ctb;
        ps_pps->ps_tile->u2_ht = ps_sps->i2_pic_ht_in_ctb;
    }

    BITS_PARSE("loop_filter_across_slices_enabled_flag", value, ps_bitstrm, 1);
    ps_pps->i1_loop_filter_across_slices_enabled_flag = value;

    BITS_PARSE("deblocking_filter_control_present_flag", value, ps_bitstrm, 1);
    ps_pps->i1_deblocking_filter_control_present_flag = value;

    /* Default values */
    ps_pps->i1_pic_disable_deblocking_filter_flag = 0;
    ps_pps->i1_deblocking_filter_override_enabled_flag = 0;
    ps_pps->i1_beta_offset_div2 = 0;
    ps_pps->i1_tc_offset_div2 = 0;

    if(ps_pps->i1_deblocking_filter_control_present_flag)
    {

        BITS_PARSE("deblocking_filter_override_enabled_flag", value, ps_bitstrm, 1);
        ps_pps->i1_deblocking_filter_override_enabled_flag = value;

        BITS_PARSE("pic_disable_deblocking_filter_flag", value, ps_bitstrm, 1);
        ps_pps->i1_pic_disable_deblocking_filter_flag = value;

        if(!ps_pps->i1_pic_disable_deblocking_filter_flag)
        {

            SEV_PARSE("pps_beta_offset_div2", value, ps_bitstrm);
            ps_pps->i1_beta_offset_div2 = value;

            SEV_PARSE("pps_tc_offset_div2", value, ps_bitstrm);
            ps_pps->i1_tc_offset_div2 = value;

        }
    }

    BITS_PARSE("pps_scaling_list_data_present_flag", value, ps_bitstrm, 1);
    ps_pps->i1_pps_scaling_list_data_present_flag = value;

    if(ps_pps->i1_pps_scaling_list_data_present_flag)
    {
        COPY_DEFAULT_SCALING_LIST(ps_pps->pi2_scaling_mat);
        ihevcd_scaling_list_data(ps_codec, ps_pps->pi2_scaling_mat);
    }

    BITS_PARSE("lists_modification_present_flag", value, ps_bitstrm, 1);
    ps_pps->i1_lists_modification_present_flag = value;
    UEV_PARSE("log2_parallel_merge_level_minus2", value, ps_bitstrm);
    ps_pps->i1_log2_parallel_merge_level = value + 2;

    BITS_PARSE("slice_header_extension_present_flag", value, ps_bitstrm, 1);
    ps_pps->i1_slice_header_extension_present_flag = value;
    /* Not present in HM */
    BITS_PARSE("pps_extension_flag", value, ps_bitstrm, 1);

    ps_codec->i4_pps_done = 1;
    return ret;
}